

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoding_backend_init_memory__stbvorbis
                    (void *pUserData,void *pData,size_t dataSize,ma_decoding_backend_config *pConfig
                    ,ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  void *pvVar2;
  ma_stbvorbis *pVorbis;
  undefined8 extraout_RDX;
  undefined1 auVar3 [16];
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pvVar2 = malloc(0xe0);
    auVar3._8_8_ = extraout_RDX;
    auVar3._0_8_ = pvVar2;
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    auVar3 = (undefined1  [16])
             (*pAllocationCallbacks->onMalloc)(0xe0,pAllocationCallbacks->pUserData);
  }
  pVorbis = auVar3._0_8_;
  if (pVorbis == (ma_stbvorbis *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  mVar1 = ma_stbvorbis_init_memory
                    (pData,dataSize,auVar3._8_8_,(ma_allocation_callbacks *)pConfig,pVorbis);
  if (mVar1 == MA_SUCCESS) {
    *ppBackend = pVorbis;
    return MA_SUCCESS;
  }
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    free(pVorbis);
    return mVar1;
  }
  if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*pAllocationCallbacks->onFree)(pVorbis,pAllocationCallbacks->pUserData);
    return mVar1;
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init_memory__stbvorbis(void* pUserData, const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_stbvorbis* pVorbis;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pVorbis = (ma_stbvorbis*)ma_malloc(sizeof(*pVorbis), pAllocationCallbacks);
    if (pVorbis == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_stbvorbis_init_memory(pData, dataSize, pConfig, pAllocationCallbacks, pVorbis);
    if (result != MA_SUCCESS) {
        ma_free(pVorbis, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pVorbis;

    return MA_SUCCESS;
}